

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_opt_fold.c
# Opt level: O3

TRef fold_abc_k(jit_State *J)

{
  ushort uVar1;
  uint uVar2;
  int iVar3;
  IRIns *pIVar4;
  byte bVar5;
  TRef TVar6;
  ushort uVar7;
  long lVar9;
  ulong uVar8;
  
  TVar6 = 0;
  if ((((J->fold).left[0].field_1.t.irt & 0x40) == 0) && ((J->flags & 0x800000) != 0)) {
    uVar1 = (J->fold).ins.field_0.op1;
    uVar7 = J->chain[10];
    if (uVar7 <= uVar1) {
      uVar2 = (J->cur).nins;
      uVar8 = (ulong)uVar2;
      if (J->irtoplim <= uVar2) {
        lj_ir_growtop(J);
      }
      (J->cur).nins = uVar2 + 1;
      pIVar4 = (J->cur).ir;
      bVar5 = (J->fold).ins.field_1.o;
      *(IRRef1 *)((long)pIVar4 + uVar8 * 8 + 6) = J->chain[bVar5];
      J->chain[bVar5] = (IRRef1)uVar2;
      *(byte *)((long)pIVar4 + uVar8 * 8 + 5) = bVar5;
      pIVar4[uVar8].field_0.op1 = (J->fold).ins.field_0.op1;
      *(IRRef1 *)((long)pIVar4 + uVar8 * 8 + 2) = (J->fold).ins.field_0.op2;
      iVar3 = *(int *)((long)&(J->fold).ins + 4);
      bVar5 = (byte)iVar3;
      (J->guardemit).irt = (J->guardemit).irt | bVar5;
      *(byte *)((long)pIVar4 + uVar8 * 8 + 4) = bVar5;
      return iVar3 * 0x1000000 + uVar2;
    }
    pIVar4 = (J->cur).ir;
    while ((uVar8 = (ulong)uVar7, pIVar4[uVar8].field_0.op1 != uVar1 ||
           (lVar9 = (long)*(short *)((long)pIVar4 + uVar8 * 8 + 2), lVar9 < 0))) {
      uVar7 = *(ushort *)((long)pIVar4 + uVar8 * 8 + 6);
      if (uVar7 <= uVar1) {
        TVar6 = lj_ir_emit(J);
        return TVar6;
      }
    }
    TVar6 = 4;
    if (pIVar4[lVar9].field_1.op12 < (J->fold).right[0].field_1.op12) {
      *(IRRef1 *)((long)pIVar4 + uVar8 * 8 + 2) = (J->fold).ins.field_0.op2;
    }
  }
  return TVar6;
}

Assistant:

LJFOLD(ABC any KINT)
LJFOLDF(abc_k)
{
  PHIBARRIER(fleft);
  if (LJ_LIKELY(J->flags & JIT_F_OPT_ABC)) {
    IRRef ref = J->chain[IR_ABC];
    IRRef asize = fins->op1;
    while (ref > asize) {
      IRIns *ir = IR(ref);
      if (ir->op1 == asize && irref_isk(ir->op2)) {
	uint32_t k = (uint32_t)IR(ir->op2)->i;
	if ((uint32_t)fright->i > k)
	  ir->op2 = fins->op2;
	return DROPFOLD;
      }
      ref = ir->prev;
    }
    return EMITFOLD;  /* Already performed CSE. */
  }
  return NEXTFOLD;
}